

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O0

int X509v3_get_ext_by_critical(stack_st_X509_EXTENSION *x,int crit,int lastpos)

{
  uint uVar1;
  size_t sVar2;
  X509_EXTENSION *ex_00;
  X509_EXTENSION *ex;
  int local_20;
  int n;
  int lastpos_local;
  int crit_local;
  stack_st_X509_EXTENSION *sk_local;
  
  if (x != (stack_st_X509_EXTENSION *)0x0) {
    local_20 = lastpos + 1;
    if (local_20 < 0) {
      local_20 = 0;
    }
    sVar2 = sk_X509_EXTENSION_num((stack_st_X509_EXTENSION *)x);
    for (; local_20 < (int)sVar2; local_20 = local_20 + 1) {
      ex_00 = (X509_EXTENSION *)sk_X509_EXTENSION_value((stack_st_X509_EXTENSION *)x,(long)local_20)
      ;
      uVar1 = X509_EXTENSION_get_critical(ex_00);
      if (uVar1 == (crit != 0)) {
        return local_20;
      }
    }
  }
  return -1;
}

Assistant:

int X509v3_get_ext_by_critical(const STACK_OF(X509_EXTENSION) *sk, int crit,
                               int lastpos) {
  if (sk == NULL) {
    return -1;
  }

  lastpos++;
  if (lastpos < 0) {
    lastpos = 0;
  }

  crit = !!crit;
  int n = (int)sk_X509_EXTENSION_num(sk);
  for (; lastpos < n; lastpos++) {
    const X509_EXTENSION *ex = sk_X509_EXTENSION_value(sk, lastpos);
    if (X509_EXTENSION_get_critical(ex) == crit) {
      return lastpos;
    }
  }
  return -1;
}